

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int coda_inflateResetKeep(z_streamp strm)

{
  internal_state *piVar1;
  internal_state *piVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = inflateStateCheck(strm);
  iVar4 = -2;
  if (iVar3 == 0) {
    piVar2 = strm->state;
    iVar4 = 0;
    *(undefined8 *)(piVar2 + 0x28) = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    strm->msg = (char *)0x0;
    if (*(uint *)(piVar2 + 0x10) != 0) {
      strm->adler = (ulong)(*(uint *)(piVar2 + 0x10) & 1);
    }
    *(undefined8 *)(piVar2 + 8) = 0x3f34;
    *(undefined8 *)(piVar2 + 0x14) = 0xffffffff00000000;
    *(undefined4 *)(piVar2 + 0x1c) = 0x8000;
    *(undefined8 *)(piVar2 + 0x30) = 0;
    *(undefined8 *)(piVar2 + 0x50) = 0;
    *(undefined4 *)(piVar2 + 0x58) = 0;
    piVar1 = piVar2 + 0x558;
    *(internal_state **)(piVar2 + 0x90) = piVar1;
    *(internal_state **)(piVar2 + 0x70) = piVar1;
    *(internal_state **)(piVar2 + 0x68) = piVar1;
    *(undefined8 *)(piVar2 + 0x1be8) = 0xffffffff00000001;
  }
  return iVar4;
}

Assistant:

int ZEXPORT inflateResetKeep(z_streamp strm) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    if (state->wrap)        /* to support ill-conceived Java test suite */
        strm->adler = state->wrap & 1;
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->flags = -1;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->sane = 1;
    state->back = -1;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}